

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::ComputeImportInfo
          (cmGeneratorTarget *this,string *desired_config,ImportInfo *info)

{
  bool bVar1;
  TargetType TVar2;
  ManagedType MVar3;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  _Var4;
  cmValue cVar5;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar6;
  cmGeneratorTarget *this_00;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __begin2;
  string_view value;
  cmBTStringRange cVar7;
  string linkProp;
  string linkProp_3;
  string suffix;
  cmValue imp;
  cmValue loc;
  string sStack_d8;
  cmAlphaNum local_b8;
  string local_88;
  undefined1 local_68 [48];
  undefined1 local_38 [16];
  
  info->NoSOName = false;
  local_38._8_8_ = 0;
  local_38._0_8_ = (string *)0x0;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  bVar1 = cmTarget::GetMappedConfig
                    (this->Target,desired_config,(cmValue *)(local_38 + 8),(cmValue *)local_38,
                     &local_88);
  if (!bVar1) goto LAB_0034bf3e;
  cVar7 = cmTarget::GetLinkInterfaceEntries_abi_cxx11_(this->Target);
  _Var4 = cVar7.Begin._M_current;
  if (_Var4._M_current == cVar7.End._M_current._M_current) {
    TVar2 = GetType(this);
    if (TVar2 != INTERFACE_LIBRARY) {
      local_b8.View_._M_len = 0x21;
      local_b8.View_._M_str = "IMPORTED_LINK_INTERFACE_LIBRARIES";
      local_68._0_8_ = local_88._M_string_length;
      local_68._8_8_ = local_88._M_dataplus._M_p;
      cmStrCat<>(&sStack_d8,&local_b8,(cmAlphaNum *)local_68);
      cVar5 = GetProperty(this,&sStack_d8);
      if (cVar5.Value == (string *)0x0) {
        std::__cxx11::string::assign((char *)&sStack_d8);
        cVar5 = GetProperty(this,&sStack_d8);
        if (cVar5.Value != (string *)0x0) goto LAB_0034b94a;
      }
      else {
LAB_0034b94a:
        std::__cxx11::string::_M_assign((string *)&info->LibrariesProp);
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   &info->Libraries,cVar5.Value);
      }
      std::__cxx11::string::~string((string *)&sStack_d8);
    }
  }
  else {
    std::__cxx11::string::assign((char *)&info->LibrariesProp);
    for (; _Var4._M_current != cVar7.End._M_current._M_current;
        _Var4._M_current = _Var4._M_current + 1) {
      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
      emplace_back<BT<std::__cxx11::string>const&>
                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                 &info->Libraries,_Var4._M_current);
    }
  }
  cVar7 = cmTarget::GetLinkInterfaceDirectEntries_abi_cxx11_(this->Target);
  for (_Var4 = cVar7.Begin._M_current; _Var4._M_current != cVar7.End._M_current._M_current;
      _Var4._M_current = _Var4._M_current + 1) {
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    emplace_back<BT<std::__cxx11::string>const&>
              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
               &info->LibrariesHeadInclude,_Var4._M_current);
  }
  cVar7 = cmTarget::GetLinkInterfaceDirectExcludeEntries_abi_cxx11_(this->Target);
  for (_Var4 = cVar7.Begin._M_current; _Var4._M_current != cVar7.End._M_current._M_current;
      _Var4._M_current = _Var4._M_current + 1) {
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    emplace_back<BT<std::__cxx11::string>const&>
              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
               &info->LibrariesHeadExclude,_Var4._M_current);
  }
  TVar2 = GetType(this);
  if (TVar2 == INTERFACE_LIBRARY) {
    if (local_38._8_8_ != 0) {
      std::__cxx11::string::_M_assign((string *)&info->LibName);
    }
    goto LAB_0034bf3e;
  }
  if (local_38._8_8_ == 0) {
    local_b8.View_._M_len = (size_t)&DAT_00000011;
    local_b8.View_._M_str = "IMPORTED_LOCATION";
    local_68._0_8_ = local_88._M_string_length;
    local_68._8_8_ = local_88._M_dataplus._M_p;
    cmStrCat<>(&sStack_d8,&local_b8,(cmAlphaNum *)local_68);
    cVar5 = GetProperty(this,&sStack_d8);
    if (cVar5.Value == (string *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"IMPORTED_LOCATION",(allocator<char> *)local_68);
      cVar5 = GetProperty(this,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      if (cVar5.Value != (string *)0x0) {
        std::__cxx11::string::_M_assign((string *)&info->Location);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&info->Location);
    }
    std::__cxx11::string::~string((string *)&sStack_d8);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&info->Location);
  }
  TVar2 = GetType(this);
  if (TVar2 == SHARED_LIBRARY) {
    local_b8.View_._M_len = 0xf;
    local_b8.View_._M_str = "IMPORTED_SONAME";
    local_68._0_8_ = local_88._M_string_length;
    local_68._8_8_ = local_88._M_dataplus._M_p;
    cmStrCat<>(&sStack_d8,&local_b8,(cmAlphaNum *)local_68);
    cVar5 = GetProperty(this,&sStack_d8);
    if (cVar5.Value == (string *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"IMPORTED_SONAME",(allocator<char> *)local_68);
      cVar5 = GetProperty(this,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      if (cVar5.Value != (string *)0x0) {
        std::__cxx11::string::_M_assign((string *)&info->SOName);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&info->SOName);
    }
    std::__cxx11::string::~string((string *)&sStack_d8);
  }
  TVar2 = GetType(this);
  if (TVar2 == SHARED_LIBRARY) {
    local_b8.View_._M_len = 0x12;
    local_b8.View_._M_str = "IMPORTED_NO_SONAME";
    local_68._0_8_ = local_88._M_string_length;
    local_68._8_8_ = local_88._M_dataplus._M_p;
    cmStrCat<>(&sStack_d8,&local_b8,(cmAlphaNum *)local_68);
    cVar5 = GetProperty(this,&sStack_d8);
    pcVar6 = extraout_RDX;
    if (cVar5.Value == (string *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"IMPORTED_NO_SONAME",(allocator<char> *)local_68);
      cVar5 = GetProperty(this,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      pcVar6 = extraout_RDX_00;
      if (cVar5.Value != (string *)0x0) goto LAB_0034bbdf;
    }
    else {
LAB_0034bbdf:
      value._M_str = pcVar6;
      value._M_len = (size_t)((cVar5.Value)->_M_dataplus)._M_p;
      bVar1 = cmValue::IsOn((cmValue *)(cVar5.Value)->_M_string_length,value);
      info->NoSOName = bVar1;
    }
    std::__cxx11::string::~string((string *)&sStack_d8);
  }
  if ((string *)local_38._0_8_ == (string *)0x0) {
    TVar2 = GetType(this);
    if (TVar2 != SHARED_LIBRARY) {
      bVar1 = IsExecutableWithExports(this);
      if (!bVar1) goto LAB_0034bcc9;
    }
    local_b8.View_._M_len = 0xf;
    local_b8.View_._M_str = "IMPORTED_IMPLIB";
    local_68._0_8_ = local_88._M_string_length;
    local_68._8_8_ = local_88._M_dataplus._M_p;
    cmStrCat<>(&sStack_d8,&local_b8,(cmAlphaNum *)local_68);
    cVar5 = GetProperty(this,&sStack_d8);
    if (cVar5.Value == (string *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"IMPORTED_IMPLIB",(allocator<char> *)local_68);
      cVar5 = GetProperty(this,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      if (cVar5.Value != (string *)0x0) {
        std::__cxx11::string::_M_assign((string *)&info->ImportLibrary);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&info->ImportLibrary);
    }
    std::__cxx11::string::~string((string *)&sStack_d8);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&info->ImportLibrary);
  }
LAB_0034bcc9:
  local_b8.View_._M_len = 0x21;
  local_b8.View_._M_str = "IMPORTED_LINK_DEPENDENT_LIBRARIES";
  local_68._0_8_ = local_88._M_string_length;
  local_68._8_8_ = local_88._M_dataplus._M_p;
  cmStrCat<>(&sStack_d8,&local_b8,(cmAlphaNum *)local_68);
  cVar5 = GetProperty(this,&sStack_d8);
  if (cVar5.Value == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"IMPORTED_LINK_DEPENDENT_LIBRARIES",(allocator<char> *)local_68);
    cVar5 = GetProperty(this,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    if (cVar5.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&info->SharedDeps);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&info->SharedDeps);
  }
  std::__cxx11::string::~string((string *)&sStack_d8);
  bVar1 = LinkLanguagePropagatesToDependents(this);
  if (bVar1) {
    local_b8.View_._M_len = 0x21;
    local_b8.View_._M_str = "IMPORTED_LINK_INTERFACE_LANGUAGES";
    local_68._0_8_ = local_88._M_string_length;
    local_68._8_8_ = local_88._M_dataplus._M_p;
    cmStrCat<>(&sStack_d8,&local_b8,(cmAlphaNum *)local_68);
    cVar5 = GetProperty(this,&sStack_d8);
    if (cVar5.Value == (string *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"IMPORTED_LINK_INTERFACE_LANGUAGES",(allocator<char> *)local_68
                );
      cVar5 = GetProperty(this,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      if (cVar5.Value != (string *)0x0) {
        std::__cxx11::string::_M_assign((string *)&info->Languages);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&info->Languages);
    }
    std::__cxx11::string::~string((string *)&sStack_d8);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"IMPORTED_COMMON_LANGUAGE_RUNTIME",(allocator<char> *)local_68);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8,
                 &local_88);
  cVar5 = GetProperty(this,(string *)local_68);
  this_00 = (cmGeneratorTarget *)local_68;
  std::__cxx11::string::~string((string *)this_00);
  if (cVar5.Value == (string *)0x0) {
    this_00 = this;
    cVar5 = GetProperty(this,(string *)&local_b8);
    if (cVar5.Value != (string *)0x0) goto LAB_0034be7b;
  }
  else {
LAB_0034be7b:
    MVar3 = CheckManagedType(this_00,cVar5.Value);
    info->Managed = MVar3;
  }
  std::__cxx11::string::~string((string *)&local_b8);
  TVar2 = GetType(this);
  if (TVar2 != STATIC_LIBRARY) goto LAB_0034bf3e;
  local_b8.View_._M_len = 0x24;
  local_b8.View_._M_str = "IMPORTED_LINK_INTERFACE_MULTIPLICITY";
  local_68._0_8_ = local_88._M_string_length;
  local_68._8_8_ = local_88._M_dataplus._M_p;
  cmStrCat<>(&sStack_d8,&local_b8,(cmAlphaNum *)local_68);
  cVar5 = GetProperty(this,&sStack_d8);
  if (cVar5.Value == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"IMPORTED_LINK_INTERFACE_MULTIPLICITY",
               (allocator<char> *)local_68);
    cVar5 = GetProperty(this,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    if (cVar5.Value != (string *)0x0) goto LAB_0034bf1e;
  }
  else {
LAB_0034bf1e:
    __isoc99_sscanf(((cVar5.Value)->_M_dataplus)._M_p,"%u",&info->Multiplicity);
  }
  std::__cxx11::string::~string((string *)&sStack_d8);
LAB_0034bf3e:
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeImportInfo(std::string const& desired_config,
                                          ImportInfo& info) const
{
  // This method finds information about an imported target from its
  // properties.  The "IMPORTED_" namespace is reserved for properties
  // defined by the project exporting the target.

  // Initialize members.
  info.NoSOName = false;

  cmValue loc = nullptr;
  cmValue imp = nullptr;
  std::string suffix;
  if (!this->Target->GetMappedConfig(desired_config, loc, imp, suffix)) {
    return;
  }

  // Get the link interface.
  {
    // Use the INTERFACE_LINK_LIBRARIES special representation directly
    // to get backtraces.
    cmBTStringRange entries = this->Target->GetLinkInterfaceEntries();
    if (!entries.empty()) {
      info.LibrariesProp = "INTERFACE_LINK_LIBRARIES";
      for (BT<std::string> const& entry : entries) {
        info.Libraries.emplace_back(entry);
      }
    } else if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
      std::string linkProp =
        cmStrCat("IMPORTED_LINK_INTERFACE_LIBRARIES", suffix);
      cmValue propertyLibs = this->GetProperty(linkProp);
      if (!propertyLibs) {
        linkProp = "IMPORTED_LINK_INTERFACE_LIBRARIES";
        propertyLibs = this->GetProperty(linkProp);
      }
      if (propertyLibs) {
        info.LibrariesProp = linkProp;
        info.Libraries.emplace_back(*propertyLibs);
      }
    }
  }
  for (BT<std::string> const& entry :
       this->Target->GetLinkInterfaceDirectEntries()) {
    info.LibrariesHeadInclude.emplace_back(entry);
  }
  for (BT<std::string> const& entry :
       this->Target->GetLinkInterfaceDirectExcludeEntries()) {
    info.LibrariesHeadExclude.emplace_back(entry);
  }
  if (this->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    if (loc) {
      info.LibName = *loc;
    }
    return;
  }

  // A provided configuration has been chosen.  Load the
  // configuration's properties.

  // Get the location.
  if (loc) {
    info.Location = *loc;
  } else {
    std::string impProp = cmStrCat("IMPORTED_LOCATION", suffix);
    if (cmValue config_location = this->GetProperty(impProp)) {
      info.Location = *config_location;
    } else if (cmValue location = this->GetProperty("IMPORTED_LOCATION")) {
      info.Location = *location;
    }
  }

  // Get the soname.
  if (this->GetType() == cmStateEnums::SHARED_LIBRARY) {
    std::string soProp = cmStrCat("IMPORTED_SONAME", suffix);
    if (cmValue config_soname = this->GetProperty(soProp)) {
      info.SOName = *config_soname;
    } else if (cmValue soname = this->GetProperty("IMPORTED_SONAME")) {
      info.SOName = *soname;
    }
  }

  // Get the "no-soname" mark.
  if (this->GetType() == cmStateEnums::SHARED_LIBRARY) {
    std::string soProp = cmStrCat("IMPORTED_NO_SONAME", suffix);
    if (cmValue config_no_soname = this->GetProperty(soProp)) {
      info.NoSOName = cmIsOn(*config_no_soname);
    } else if (cmValue no_soname = this->GetProperty("IMPORTED_NO_SONAME")) {
      info.NoSOName = cmIsOn(*no_soname);
    }
  }

  // Get the import library.
  if (imp) {
    info.ImportLibrary = *imp;
  } else if (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
             this->IsExecutableWithExports()) {
    std::string impProp = cmStrCat("IMPORTED_IMPLIB", suffix);
    if (cmValue config_implib = this->GetProperty(impProp)) {
      info.ImportLibrary = *config_implib;
    } else if (cmValue implib = this->GetProperty("IMPORTED_IMPLIB")) {
      info.ImportLibrary = *implib;
    }
  }

  // Get the link dependencies.
  {
    std::string linkProp =
      cmStrCat("IMPORTED_LINK_DEPENDENT_LIBRARIES", suffix);
    if (cmValue config_libs = this->GetProperty(linkProp)) {
      info.SharedDeps = *config_libs;
    } else if (cmValue libs =
                 this->GetProperty("IMPORTED_LINK_DEPENDENT_LIBRARIES")) {
      info.SharedDeps = *libs;
    }
  }

  // Get the link languages.
  if (this->LinkLanguagePropagatesToDependents()) {
    std::string linkProp =
      cmStrCat("IMPORTED_LINK_INTERFACE_LANGUAGES", suffix);
    if (cmValue config_libs = this->GetProperty(linkProp)) {
      info.Languages = *config_libs;
    } else if (cmValue libs =
                 this->GetProperty("IMPORTED_LINK_INTERFACE_LANGUAGES")) {
      info.Languages = *libs;
    }
  }

  // Get information if target is managed assembly.
  {
    std::string linkProp = "IMPORTED_COMMON_LANGUAGE_RUNTIME";
    if (cmValue pc = this->GetProperty(linkProp + suffix)) {
      info.Managed = this->CheckManagedType(*pc);
    } else if (cmValue p = this->GetProperty(linkProp)) {
      info.Managed = this->CheckManagedType(*p);
    }
  }

  // Get the cyclic repetition count.
  if (this->GetType() == cmStateEnums::STATIC_LIBRARY) {
    std::string linkProp =
      cmStrCat("IMPORTED_LINK_INTERFACE_MULTIPLICITY", suffix);
    if (cmValue config_reps = this->GetProperty(linkProp)) {
      sscanf(config_reps->c_str(), "%u", &info.Multiplicity);
    } else if (cmValue reps =
                 this->GetProperty("IMPORTED_LINK_INTERFACE_MULTIPLICITY")) {
      sscanf(reps->c_str(), "%u", &info.Multiplicity);
    }
  }
}